

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

uint __thiscall
Inline::HandleDifferentTypesSameFunction
          (Inline *this,FixedFieldInfo *fixedFunctionInfoArray,uint16 cachedFixedInlineeCount)

{
  FixedFieldIDL *this_00;
  long lVar1;
  uint uVar2;
  intptr_t iVar3;
  intptr_t iVar4;
  int iVar5;
  undefined6 in_register_00000012;
  FixedFieldIDL *this_01;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  undefined1 local_c0 [8];
  FixedFieldInfo tmpInfo;
  
  iVar5 = (int)CONCAT62(in_register_00000012,cachedFixedInlineeCount);
  if (iVar5 != 0) {
    uVar2 = 0;
    uVar8 = CONCAT62(in_register_00000012,cachedFixedInlineeCount) & 0xffffffff;
    do {
      uVar6 = uVar2 + 1;
      if ((ushort)uVar6 < cachedFixedInlineeCount) {
        uVar10 = (iVar5 + -1) - uVar2;
        lVar1 = (ulong)((uVar2 & 0xffff) << 5) * 3;
        tmpInfo.m_data.environmentAddr.ptr =
             (void *)((long)&(fixedFunctionInfoArray->m_data).valueType + lVar1);
        this_01 = (FixedFieldIDL *)((long)&fixedFunctionInfoArray[1].m_data.valueType + lVar1);
        do {
          iVar3 = FixedFieldInfo::GetFieldValue
                            ((FixedFieldInfo *)tmpInfo.m_data.environmentAddr.ptr);
          iVar4 = FixedFieldInfo::GetFieldValue((FixedFieldInfo *)this_01);
          if (iVar3 == iVar4) {
            FixedFieldIDL::FixedFieldIDL((FixedFieldIDL *)local_c0,this_01);
            uVar7 = (ulong)((uVar6 & 0xffff) * 0x60);
            this_00 = (FixedFieldIDL *)((long)&(fixedFunctionInfoArray->m_data).valueType + uVar7);
            FixedFieldIDL::operator=(this_01,this_00);
            FixedFieldIDL::operator=(this_00,(FixedFieldIDL *)local_c0);
            FixedFieldInfo::SetNextHasSameFixedField
                      ((FixedFieldInfo *)
                       ((long)&fixedFunctionInfoArray[-1].m_data.valueType + uVar7));
            uVar6 = uVar6 + 1;
            uVar8 = (ulong)((int)uVar8 - 1);
          }
          this_01 = this_01 + 1;
          uVar9 = (short)uVar10 - 1;
          uVar10 = (uint)uVar9;
        } while (uVar9 != 0);
      }
      uVar2 = uVar6;
    } while ((ushort)uVar2 < cachedFixedInlineeCount);
    return (uint)uVar8 & 0xffff;
  }
  return 0;
}

Assistant:

uint
Inline::HandleDifferentTypesSameFunction(__inout_ecount(cachedFixedInlineeCount) FixedFieldInfo* fixedFunctionInfoArray, uint16 cachedFixedInlineeCount)
{
    uint16 uniqueCount = cachedFixedInlineeCount;
    uint16 swapIndex;
    for (uint16 i = 0; i < cachedFixedInlineeCount; i++)
    {
        swapIndex = i+1;
        for (uint16 j = i+1; j < cachedFixedInlineeCount; j++)
        {
            if (fixedFunctionInfoArray[i].GetFieldValue() == fixedFunctionInfoArray[j].GetFieldValue())
            {
                FixedFieldInfo tmpInfo = fixedFunctionInfoArray[j];
                fixedFunctionInfoArray[j] = fixedFunctionInfoArray[swapIndex];
                fixedFunctionInfoArray[swapIndex] = tmpInfo;
                fixedFunctionInfoArray[swapIndex - 1].SetNextHasSameFixedField();
                swapIndex++;
                uniqueCount--;
            }
        }
        i = swapIndex-1;
    }
    return uniqueCount;
}